

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deflate.cpp
# Opt level: O0

void __thiscall DeflateEncoder::run(DeflateEncoder *this)

{
  ostream *poVar1;
  string local_188;
  string local_168;
  undefined1 local_148 [8];
  HuffmanEncoder huffman;
  string local_80;
  undefined1 local_60 [8];
  Lz77Encoder lz77;
  DeflateEncoder *this_local;
  
  lz77.super_Cryptor._72_8_ = this;
  poVar1 = std::operator<<((ostream *)&std::cout,"Deflate encryption...");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Cryptor::get_in_message_abi_cxx11_(&local_80,&this->super_Cryptor);
  Lz77Encoder::Lz77Encoder((Lz77Encoder *)local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  Lz77Encoder::run((Lz77Encoder *)local_60);
  Cryptor::get_out_message_abi_cxx11_(&local_168,(Cryptor *)local_60);
  HuffmanEncoder::HuffmanEncoder((HuffmanEncoder *)local_148,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  HuffmanEncoder::run((HuffmanEncoder *)local_148);
  Cryptor::get_out_message_abi_cxx11_(&local_188,(Cryptor *)local_148);
  Cryptor::set_out_message(&this->super_Cryptor,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  poVar1 = std::operator<<((ostream *)&std::cout,"encryption done");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  HuffmanEncoder::~HuffmanEncoder((HuffmanEncoder *)local_148);
  Lz77Encoder::~Lz77Encoder((Lz77Encoder *)local_60);
  return;
}

Assistant:

void DeflateEncoder::run() {
  cout << "Deflate encryption..." << endl;

  Lz77Encoder lz77(get_in_message());
  lz77.run();
  HuffmanEncoder huffman(lz77.get_out_message());
  huffman.run();
  set_out_message(huffman.get_out_message());

  cout << "encryption done" << endl;
}